

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ubjson_cursor_tests.cpp
# Opt level: O0

bool __thiscall
remove_mark_ubjson_filter::operator()
          (remove_mark_ubjson_filter *this,staj_event *event,ser_context *param_3)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  staj_event_type sVar1;
  bool bVar2;
  char *in_RDX;
  basic_staj_event<char> *in_RSI;
  basic_staj_event<char> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  char *in_stack_ffffffffffffffc8;
  char *pcVar4;
  basic_staj_event<char> *this_00;
  
  this_00 = in_RDI;
  sVar1 = jsoncons::basic_staj_event<char>::event_type(in_RSI);
  if (sVar1 == key) {
    bVar3 = jsoncons::basic_staj_event<char>::
            get<std::basic_string_view<char,std::char_traits<char>>>(this_00);
    pcVar4 = bVar3._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)bVar3._M_len,
               in_stack_ffffffffffffffc8);
    bVar3._M_str = (char *)this_00;
    bVar3._M_len = (size_t)in_RSI;
    __y._M_str = in_RDX;
    __y._M_len = (size_t)pcVar4;
    bVar2 = std::operator==(bVar3,__y);
    if (bVar2) {
      in_RDI->event_type_ = string_value;
      return false;
    }
  }
  bVar2 = (in_RDI->event_type_ & string_value) == key;
  if (!bVar2) {
    in_RDI->event_type_ = key;
  }
  return bVar2;
}

Assistant:

bool operator()(const staj_event& event, const ser_context&) 
    {
        if (event.event_type()  == staj_event_type::key &&
            event.get<jsoncons::string_view>() == "mark")
        {
            reject_next_ = true;
            return false;
        }
        else if (reject_next_)
        {
            reject_next_ = false;
            return false;
        }
        else
        {
            return true;
        }
    }